

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.c
# Opt level: O0

double Exponential(double dMean,long nStream)

{
  long lVar1;
  long in_RDI;
  double in_XMM0_Qa;
  double dTemp;
  long local_18;
  double local_8;
  
  if ((in_RDI < 0) || (local_18 = in_RDI, 0x31 < in_RDI)) {
    local_18 = 0;
  }
  if (0.0 < in_XMM0_Qa) {
    lVar1 = NextRand(Seed[local_18].value);
    Seed[local_18].value = lVar1;
    local_8 = log(1.0 - (double)Seed[local_18].value / dM);
    local_8 = -in_XMM0_Qa * local_8;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double
Exponential(double dMean, long nStream)

/*
 * Returns a double uniformly distributed with mean dMean.  
 * 0.0 is returned iff dMean <= 0.0. nStream is the random number 
 * stream. Stream 0 is used if nStream is not in the range 
 * 0..MAX_STREAM.
 */

{
    double          dTemp;

    if (nStream < 0 || nStream > MAX_STREAM)
        nStream = 0;
    if (dMean <= 0.0)
        return (0.0);

    Seed[nStream].value = NextRand(Seed[nStream].value);
    dTemp = (double) Seed[nStream].value / dM;        /* unif between 0..1 */
    return (-dMean * log(1.0 - dTemp));
}